

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniforms.cpp
# Opt level: O3

void __thiscall Uniforms::unflagChange(Uniforms *this)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr p_Var2;
  Camera *pCVar3;
  _Base_ptr p_Var4;
  _Base_ptr p_Var5;
  _Rb_tree_node_base *p_Var6;
  byte bVar7;
  bool bVar8;
  
  if (this->m_change == true) {
    this->m_change = false;
    p_Var5 = (this->data)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var1 = &(this->data)._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var5 != p_Var1) {
      bVar7 = 0;
      do {
        p_Var2 = p_Var5[2]._M_left;
        bVar8 = p_Var5[3]._M_left != p_Var2;
        if (bVar8) {
          p_Var4 = p_Var2->_M_parent;
          p_Var5[4]._M_left = *(_Base_ptr *)p_Var2;
          p_Var5[4]._M_right = p_Var4;
          std::deque<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>::pop_front
                    ((deque<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_> *)
                     (p_Var5 + 2));
          bVar7 = this->m_change;
        }
        *(bool *)((long)&p_Var5[5]._M_parent + 1) = bVar8;
        bVar7 = bVar7 | bVar8;
        this->m_change = (bool)bVar7;
        p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
      } while ((_Rb_tree_header *)p_Var5 != p_Var1);
    }
  }
  for (p_Var6 = (this->super_Scene).lights._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var6 != &(this->super_Scene).lights._M_t._M_impl.super__Rb_tree_header;
      p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6)) {
    *(undefined1 *)(*(long *)(p_Var6 + 2) + 0x20) = 0;
  }
  pCVar3 = (this->super_Scene).activeCamera;
  if (pCVar3 != (Camera *)0x0) {
    (pCVar3->super_Node).bChange = false;
  }
  return;
}

Assistant:

void Uniforms::unflagChange() {
    if (m_change) {
        m_change = false;

        // Flag all user uniforms as NOT changed
        for (UniformDataMap::iterator it = data.begin(); it != data.end(); ++it)
            m_change += it->second.check();
    }

    for (vera::LightsMap::iterator it = lights.begin(); it != lights.end(); ++it)
        it->second->bChange = false;

    if (activeCamera)
        activeCamera->bChange = false;
}